

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CX.hpp
# Opt level: O2

void __thiscall
qclab::qgates::CX<std::complex<double>_>::CX
          (CX<std::complex<double>_> *this,int control,int target,int controlState)

{
  uint __line;
  char *__assertion;
  int target_local;
  
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00131240;
  std::make_unique<qclab::qgates::PauliX<std::complex<double>>,int_const&>((int *)&this->gate_);
  if (control < 0) {
    __assertion = "control >= 0";
  }
  else {
    if (-1 < target) {
      if (target != control) {
        return;
      }
      __assertion = "control != target";
      __line = 0x2c;
      goto LAB_00119fdb;
    }
    __assertion = "target >= 0";
  }
  __line = 0x2b;
LAB_00119fdb:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CX.hpp"
                ,__line,
                "qclab::qgates::CX<std::complex<double>>::CX(const int, const int, const int) [T = std::complex<double>]"
               );
}

Assistant:

CX( const int control , const int target ,
                 const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< PauliX< T > >( target ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }